

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O0

ModeSense __thiscall SCSI::Target::CommandState::mode_sense_specs(CommandState *this)

{
  ModeSense MVar1;
  uint16_t uVar2;
  byte *pbVar3;
  const_reference pvVar4;
  CommandState *this_local;
  uint uStack_10;
  ModeSense specs;
  
  ModeSense::ModeSense((ModeSense *)((long)&this_local + 4));
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,1);
  this_local._4_4_ = CONCAT31(this_local._5_3_,(char)((*pbVar3 & 8) >> 3));
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,2);
  uStack_10 = (uint)(*pbVar3 >> 5);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,2);
  specs._0_4_ = CONCAT31(specs._1_3_,*pvVar4) & 0xffffff3f;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this->data_,3);
  specs._1_1_ = *pvVar4;
  uVar2 = number_of_blocks(this);
  MVar1.page_control_values = uStack_10;
  MVar1._0_4_ = this_local._4_4_;
  MVar1.page_code = specs.exclude_block_descriptors;
  MVar1.subpage_code = specs._1_1_;
  MVar1.allocated_bytes = uVar2;
  return MVar1;
}

Assistant:

CommandState::ModeSense CommandState::mode_sense_specs() const {
	ModeSense specs;

	specs.exclude_block_descriptors = (data_[1] & 0x08);
	specs.page_control_values = ModeSense::PageControlValues(data_[2] >> 5);
	specs.page_code = data_[2] & 0x3f;
	specs.subpage_code = data_[3];
	specs.allocated_bytes = number_of_blocks();

	return specs;
}